

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::Deallocate<4ul,std::allocator<char32_t>>
               (allocator<char32_t> *alloc,void *p,size_t n)

{
  long in_RDX;
  A mem_alloc;
  M *p_00;
  uint3 in_stack_ffffffffffffffd0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffd4;
  M local_19 [6];
  
  uVar1 = (uint)in_stack_ffffffffffffffd0;
  if (in_RDX != 0) {
    uVar1 = CONCAT13(1,in_stack_ffffffffffffffd0);
  }
  if ((char)(uVar1 >> 0x18) == '\0') {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                  ,0x1222,
                  "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 4UL, Alloc = std::allocator<char32_t>]"
                 );
  }
  p_00 = local_19;
  std::allocator<M>::allocator<char32_t>
            ((allocator<M> *)CONCAT44(in_stack_ffffffffffffffd4,uVar1),(allocator<char32_t> *)p_00);
  allocator_traits<std::allocator<M>_>::deallocate
            ((allocator<M> *)CONCAT44(in_stack_ffffffffffffffd4,uVar1),p_00,0x166312);
  std::allocator<M>::~allocator((allocator<M> *)0x16631e);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n)
		{
			static_assert(Alignment > 0, "");
			assert(n && "n must be positive");
			struct alignas(Alignment) M {};
			using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
			using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
			A mem_alloc(*alloc);
			AT::deallocate(mem_alloc, static_cast<M*>(p),
			               (n + sizeof(M) - 1) / sizeof(M));
		}